

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yescrypt-simd.c
# Opt level: O1

int yescrypt_kdf_body(yescrypt_shared_t *shared,yescrypt_local_t *local,uint8_t *passwd,
                     size_t passwdlen,uint8_t *salt,size_t saltlen,uint64_t N,uint32_t r,uint32_t p,
                     uint32_t t,yescrypt_flags_t flags,uint8_t *buf,size_t buflen)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  int *piVar5;
  ulong uVar6;
  ulong uVar7;
  void *pvVar8;
  ulong uVar9;
  salsa20_blk_t *XY;
  salsa20_blk_t *S;
  salsa20_blk_t *VROM;
  long lVar10;
  uint8_t *buf_00;
  ulong uVar11;
  ulong dkLen;
  ulong size;
  ulong r_00;
  uint8_t *puVar12;
  size_t clen;
  bool bVar13;
  salsa20_blk_t *local_1b0;
  yescrypt_region_t tmp;
  uint8_t sha256 [32];
  uint8_t dk [32];
  HMAC_SHA256_CTX_Y ctx;
  
  if ((flags & ~(__YESCRYPT_PREHASH|__YESCRYPT_INIT_SHARED|YESCRYPT_WORM|YESCRYPT_RW)) != 0)
  goto LAB_001211a3;
  if (buflen < 0x1fffffffe1) {
    r_00 = CONCAT44(0,r);
    uVar11 = CONCAT44(0,p);
    if ((uVar11 * r_00 < 0x40000000) && (N >> 0x20 == 0)) {
      if ((p != 0) && (((r != 0 && (3 < N)) && ((N + 0xffffffff & N) == 0)))) {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar11;
        if ((r_00 <= SUB168((ZEXT416(0) << 0x40 | ZEXT816(0xffffffffffffff)) / auVar1,0)) &&
           (auVar2._8_8_ = 0, auVar2._0_8_ = r_00,
           N <= SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x1ffffffffffffff)) / auVar2,0))) {
          if (((flags & YESCRYPT_RW) != 0) && (N / uVar11 < 4)) goto LAB_001211a3;
          if (shared == (yescrypt_shared_t *)0x0) {
            VROM = (salsa20_blk_t *)0x0;
            uVar6 = 0;
          }
          else {
            auVar3._8_8_ = 0;
            auVar3._0_8_ = shared->aligned_size;
            uVar6 = SUB168(auVar3 / (ZEXT416(r) << 7),0);
            if (uVar6 >> 0x20 != 0) goto LAB_00121205;
            if ((((flags & YESCRYPT_RW) == 0) || (uVar6 < 2)) ||
               (uVar7 = uVar6 - (uVar6 >> 1 & 0x5555555555555555),
               uVar7 = (uVar7 >> 2 & 0x3333333333333333) + (uVar7 & 0x3333333333333333),
               1 < (byte)(((uVar7 >> 4) + uVar7 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38)))
            goto LAB_001211a3;
            VROM = (salsa20_blk_t *)shared->aligned;
          }
          lVar10 = r_00 * 0x80;
          uVar7 = lVar10 * N;
          if ((flags & __YESCRYPT_INIT_SHARED) == 0) {
            local_1b0 = (salsa20_blk_t *)0x0;
            uVar9 = uVar7;
          }
          else {
            if (local->aligned_size < uVar7) {
              if (((local->base != (void *)0x0) || (local->aligned != (void *)0x0)) ||
                 (local->aligned_size != 0 || local->base_size != 0)) goto LAB_001211a3;
              pvVar8 = alloc_region(local,uVar7);
              if (pvVar8 == (void *)0x0) {
                return -1;
              }
            }
            local_1b0 = (salsa20_blk_t *)local->aligned;
            uVar9 = 0;
          }
          dkLen = lVar10 * uVar11;
          if (((!CARRY8(uVar9,dkLen)) &&
              (size = uVar9 + dkLen + r_00 * 0x100, !CARRY8(uVar9 + dkLen,r_00 * 0x100))) &&
             (((flags & YESCRYPT_RW) == 0 ||
              (bVar13 = CARRY8(size,uVar11 * 0x3040), size = size + uVar11 * 0x3040, !bVar13)))) {
            if ((flags & __YESCRYPT_INIT_SHARED) == 0) {
              tmp.base_size = 0;
              tmp.aligned_size = 0;
              tmp.base = (void *)0x0;
              tmp.aligned = (void *)0x0;
              if (local->aligned_size < size) {
                if ((local->base != (void *)0x0) &&
                   (iVar4 = munmap(local->base,local->base_size), iVar4 != 0)) {
                  return -1;
                }
                local->base_size = 0;
                local->aligned_size = 0;
                local->base = (void *)0x0;
                local->aligned = (void *)0x0;
                pvVar8 = alloc_region(local,size);
                if (pvVar8 == (void *)0x0) {
                  return -1;
                }
              }
              buf_00 = (uint8_t *)local->aligned;
              local_1b0 = (salsa20_blk_t *)(buf_00 + dkLen);
              XY = (salsa20_blk_t *)(uVar7 + (long)local_1b0);
            }
            else {
              pvVar8 = alloc_region(&tmp,size);
              if (pvVar8 == (void *)0x0) {
                return -1;
              }
              XY = (salsa20_blk_t *)((long)tmp.aligned + dkLen);
              buf_00 = (uint8_t *)tmp.aligned;
            }
            S = (salsa20_blk_t *)0x0;
            if ((flags & YESCRYPT_RW) != 0) {
              S = XY + r_00 * 4;
            }
            if (flags != 0) {
              HMAC_SHA256_Init_Y(&ctx,"yescrypt-prehash",(ulong)(0xfffff < flags) * 8 + 8);
              HMAC_SHA256_Update_Y(&ctx,passwd,passwdlen);
              passwd = sha256;
              HMAC_SHA256_Final_Y(passwd,&ctx);
              passwdlen = 0x20;
            }
            PBKDF2_SHA256(passwd,passwdlen,salt,saltlen,1,buf_00,dkLen);
            if (flags != 0 || t != 0) {
              sha256._0_8_ = *(undefined8 *)buf_00;
              sha256._8_8_ = *(undefined8 *)(buf_00 + 8);
              sha256._16_8_ = *(undefined8 *)(buf_00 + 0x10);
              sha256._24_8_ = *(undefined8 *)(buf_00 + 0x18);
            }
            if (p == 1 || (flags & YESCRYPT_RW) != 0) {
              smix(buf_00,r_00,(uint32_t)N,p,t,flags,local_1b0,(uint32_t)uVar6,VROM,XY,
                   (uint8_t *)S->w,sha256);
            }
            else {
              puVar12 = buf_00;
              if (p != 0) {
                do {
                  smix(puVar12,r_00,(uint32_t)N,1,t,flags,local_1b0,(uint32_t)uVar6,VROM,XY,
                       (uint8_t *)0x0,(uint8_t *)0x0);
                  uVar11 = uVar11 - 1;
                  puVar12 = puVar12 + lVar10;
                } while (uVar11 != 0);
              }
            }
            puVar12 = buf;
            if (buflen < 0x20 && flags != 0) {
              puVar12 = dk;
              PBKDF2_SHA256(passwd,passwdlen,buf_00,dkLen,1,puVar12,0x20);
            }
            PBKDF2_SHA256(passwd,passwdlen,buf_00,dkLen,1,buf,buflen);
            if (flags - YESCRYPT_RW < 0xfffff) {
              HMAC_SHA256_Init_Y(&ctx,puVar12,0x20);
              HMAC_SHA256_Update_Y(&ctx,"Client Key",10);
              HMAC_SHA256_Final_Y(sha256,&ctx);
              if (0x1f < buflen) {
                buflen = 0x20;
              }
              SHA256_Init_Y(&ctx.ictx);
              SHA256_Update_Y(&ctx.ictx,sha256,0x20);
              SHA256_Final_Y(dk,&ctx.ictx);
              memcpy(buf,dk,buflen);
            }
            if ((tmp.base != (void *)0x0) && (iVar4 = munmap(tmp.base,tmp.base_size), iVar4 != 0)) {
              return -1;
            }
            return 0;
          }
        }
        piVar5 = __errno_location();
        *piVar5 = 0xc;
        return -1;
      }
LAB_001211a3:
      piVar5 = __errno_location();
      *piVar5 = 0x16;
      return -1;
    }
  }
LAB_00121205:
  piVar5 = __errno_location();
  *piVar5 = 0x1b;
  return -1;
}

Assistant:

static int
yescrypt_kdf_body(const yescrypt_shared_t * shared, yescrypt_local_t * local,
    const uint8_t * passwd, size_t passwdlen,
    const uint8_t * salt, size_t saltlen,
    uint64_t N, uint32_t r, uint32_t p, uint32_t t, yescrypt_flags_t flags,
    uint8_t * buf, size_t buflen)
{
	yescrypt_region_t tmp;
	uint64_t NROM;
	const salsa20_blk_t * VROM;
	size_t B_size, V_size, XY_size, need;
	uint8_t * B, * S;
	salsa20_blk_t * V, * XY;
	uint8_t sha256[32];
	uint8_t dk[sizeof(sha256)], * dkp = buf;

	/* Sanity-check parameters */
	if (flags & ~YESCRYPT_KNOWN_FLAGS) {
		errno = EINVAL;
		return -1;
	}
#if SIZE_MAX > UINT32_MAX
	if (buflen > (((uint64_t)(1) << 32) - 1) * 32) {
		errno = EFBIG;
		return -1;
	}
#endif
	if ((uint64_t)(r) * (uint64_t)(p) >= (1 << 30)) {
		errno = EFBIG;
		return -1;
	}
	if (N > UINT32_MAX) {
		errno = EFBIG;
		return -1;
	}
	if (((N & (N - 1)) != 0) || (N <= 3) || (r < 1) || (p < 1)) {
		errno = EINVAL;
		return -1;
	}
	if ((r > SIZE_MAX / 256 / p) ||
	    (N > SIZE_MAX / 128 / r)) {
		errno = ENOMEM;
		return -1;
	}
	if (flags & YESCRYPT_RW) {
		if (N / p <= 3) {
			errno = EINVAL;
			return -1;
		}
		if (p > SIZE_MAX / Salloc) {
			errno = ENOMEM;
			return -1;
		}
	}
#ifdef _OPENMP
	else if (N > SIZE_MAX / 128 / (r * p)) {
		errno = ENOMEM;
		return -1;
	}
#endif

	NROM = 0;
	VROM = NULL;
	if (shared) {
		NROM = shared->aligned_size / ((size_t)128 * r);
		if (NROM > UINT32_MAX) {
			errno = EFBIG;
			return -1;
		}
		if (((NROM & (NROM - 1)) != 0) || (NROM <= 1) ||
		    !(flags & YESCRYPT_RW)) {
			errno = EINVAL;
			return -1;
		}
		VROM = shared->aligned;
	}

	/* Allocate memory */
	V = NULL;
	V_size = (size_t)128 * r * N;
#ifdef _OPENMP
	if (!(flags & YESCRYPT_RW))
		V_size *= p;
#endif
	need = V_size;
	if (flags & __YESCRYPT_INIT_SHARED) {
		if (local->aligned_size < need) {
			if (local->base || local->aligned ||
			    local->base_size || local->aligned_size) {
				errno = EINVAL;
				return -1;
			}
			if (!alloc_region(local, need))
				return -1;
		}
		V = (salsa20_blk_t *)local->aligned;
		need = 0;
	}
	B_size = (size_t)128 * r * p;
	need += B_size;
	if (need < B_size) {
		errno = ENOMEM;
		return -1;
	}
	XY_size = (size_t)256 * r;
#ifdef _OPENMP
	XY_size *= p;
#endif
	need += XY_size;
	if (need < XY_size) {
		errno = ENOMEM;
		return -1;
	}
	if (flags & YESCRYPT_RW) {
		size_t S_size = (size_t)Salloc * p;
		need += S_size;
		if (need < S_size) {
			errno = ENOMEM;
			return -1;
		}
	}
	if (flags & __YESCRYPT_INIT_SHARED) {
		if (!alloc_region(&tmp, need))
			return -1;
		B = (uint8_t *)tmp.aligned;
		XY = (salsa20_blk_t *)((uint8_t *)B + B_size);
	} else {
		init_region(&tmp);
		if (local->aligned_size < need) {
			if (free_region(local))
				return -1;
			if (!alloc_region(local, need))
				return -1;
		}
		B = (uint8_t *)local->aligned;
		V = (salsa20_blk_t *)((uint8_t *)B + B_size);
		XY = (salsa20_blk_t *)((uint8_t *)V + V_size);
	}
	S = NULL;
	if (flags & YESCRYPT_RW)
		S = (uint8_t *)XY + XY_size;

	if (flags) {
		HMAC_SHA256_CTX_Y ctx;
		HMAC_SHA256_Init_Y(&ctx, "yescrypt-prehash",
		    (flags & __YESCRYPT_PREHASH) ? 16 : 8);
		HMAC_SHA256_Update_Y(&ctx, passwd, passwdlen);
		HMAC_SHA256_Final_Y(sha256, &ctx);
		passwd = sha256;
		passwdlen = sizeof(sha256);
	}

	/* 1: (B_0 ... B_{p-1}) <-- PBKDF2(P, S, 1, p * MFLen) */
	PBKDF2_SHA256(passwd, passwdlen, salt, saltlen, 1, B, B_size);

	if (t || flags)
		memcpy(sha256, B, sizeof(sha256));

	if (p == 1 || (flags & YESCRYPT_RW)) {
		smix(B, r, N, p, t, flags, V, NROM, VROM, XY, S, sha256);
	} else {
		uint32_t i;

		/* 2: for i = 0 to p - 1 do */
#ifdef _OPENMP
#pragma omp parallel for default(none) private(i) shared(B, r, N, p, t, flags, V, NROM, VROM, XY, S)
#endif
		for (i = 0; i < p; i++) {
			/* 3: B_i <-- MF(B_i, N) */
#ifdef _OPENMP
			smix(&B[(size_t)128 * r * i], r, N, 1, t, flags,
			    &V[(size_t)2 * r * i * N],
			    NROM, VROM,
			    &XY[(size_t)4 * r * i], NULL, NULL);
#else
			smix(&B[(size_t)128 * r * i], r, N, 1, t, flags, V,
			    NROM, VROM, XY, NULL, NULL);
#endif
		}
	}

	dkp = buf;
	if (flags && buflen < sizeof(dk)) {
		PBKDF2_SHA256(passwd, passwdlen, B, B_size, 1, dk, sizeof(dk));
		dkp = dk;
	}

	/* 5: DK <-- PBKDF2(P, B, 1, dkLen) */
	PBKDF2_SHA256(passwd, passwdlen, B, B_size, 1, buf, buflen);

	/*
	 * Except when computing classic scrypt, allow all computation so far
	 * to be performed on the client.  The final steps below match those of
	 * SCRAM (RFC 5802), so that an extension of SCRAM (with the steps so
	 * far in place of SCRAM's use of PBKDF2 and with SHA-256 in place of
	 * SCRAM's use of SHA-1) would be usable with yescrypt hashes.
	 */
	if (flags && !(flags & __YESCRYPT_PREHASH)) {
		/* Compute ClientKey */
		{
			HMAC_SHA256_CTX_Y ctx;
			HMAC_SHA256_Init_Y(&ctx, dkp, sizeof(dk));
			HMAC_SHA256_Update_Y(&ctx, "Client Key", 10);
			HMAC_SHA256_Final_Y(sha256, &ctx);
		}
		/* Compute StoredKey */
		{
			SHA256_CTX_Y ctx;
			size_t clen = buflen;
			if (clen > sizeof(dk))
				clen = sizeof(dk);
			SHA256_Init_Y(&ctx);
			SHA256_Update_Y(&ctx, sha256, sizeof(sha256));
			SHA256_Final_Y(dk, &ctx);
			memcpy(buf, dk, clen);
		}
	}

	if (free_region(&tmp))
		return -1;

	/* Success! */
	return 0;
}